

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.cpp
# Opt level: O2

void __thiscall
duckdb::roaring::RunContainerScanState::Skip(RunContainerScanState *this,idx_t to_skip)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = to_skip + (this->super_ContainerScanState).scanned_count;
  if (this->run_index != 0) goto LAB_014c26ce;
  do {
    (*(this->super_ContainerScanState)._vptr_ContainerScanState[5])(this);
LAB_014c26ce:
    do {
      if ((uVar3 <= (this->super_ContainerScanState).scanned_count) || (this->finished != false)) {
        (this->super_ContainerScanState).scanned_count = uVar3;
        return;
      }
      uVar1 = (ulong)(this->run).start + (ulong)(this->run).length + 1;
      uVar2 = uVar1;
      if (uVar3 <= uVar1) {
        uVar2 = uVar3;
      }
      (this->super_ContainerScanState).scanned_count = uVar2;
    } while (uVar3 < uVar1);
  } while( true );
}

Assistant:

void RunContainerScanState::Skip(idx_t to_skip) {
	idx_t end = scanned_count + to_skip;
	if (!run_index) {
		LoadNextRun();
	}
	while (scanned_count < end && !finished) {
		idx_t run_end = run.start + 1 + run.length;
		scanned_count = MinValue<idx_t>(run_end, end);
		if (scanned_count == run_end) {
			LoadNextRun();
		}
	}
	// In case run_index has already reached count
	scanned_count = end;
}